

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnTableInit
          (SharedValidator *this,Location *loc,Var *segment_var,Var *table_var)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  Result RVar4;
  Result RVar5;
  char *pcVar6;
  int __c;
  Var *__s;
  TableType table_type;
  ElemType elem_type;
  TableType local_f8;
  ElemType local_d8;
  Var local_c0;
  Var local_78;
  
  RVar1 = CheckInstr(this,(Opcode)0xd3,loc);
  local_f8.limits.max._0_3_ = 0;
  local_f8.limits._11_8_ = 0;
  local_f8.element.enum_ = Any;
  local_f8.element.type_index_ = 0;
  local_f8.limits.initial._0_3_ = 0;
  local_f8.limits.initial._3_5_ = 0;
  Var::Var(&local_78,table_var);
  RVar2 = CheckTableIndex(this,&local_78,&local_f8);
  Var::~Var(&local_78);
  Var::Var(&local_c0,segment_var);
  __s = &local_c0;
  RVar3 = CheckElemSegmentIndex(this,&local_c0,&local_d8);
  Var::~Var(&local_c0);
  pcVar6 = Var::index(segment_var,(char *)__s,__c);
  RVar4 = TypeChecker::OnTableInit(&this->typechecker_,(uint32_t)pcVar6,&local_f8.limits);
  RVar5 = CheckType(this,loc,local_d8.element,local_f8.element,"table.init");
  RVar1.enum_._0_1_ =
       RVar5.enum_ == Error ||
       ((RVar4.enum_ == Error || RVar3.enum_ == Error) ||
       (RVar2.enum_ == Error || RVar1.enum_ == Error));
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnTableInit(const Location& loc,
                                    Var segment_var,
                                    Var table_var) {
  Result result = CheckInstr(Opcode::TableInit, loc);
  TableType table_type;
  ElemType elem_type;
  result |= CheckTableIndex(table_var, &table_type);
  result |= CheckElemSegmentIndex(segment_var, &elem_type);
  result |= typechecker_.OnTableInit(segment_var.index(), table_type.limits);
  result |= CheckType(loc, elem_type.element, table_type.element, "table.init");
  return result;
}